

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O3

bool xercesc_4_0::XMLUri::isValidURI(XMLUri *baseURI,XMLCh *uriStr,bool bAllowSpaces)

{
  short *psVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  XMLCh *toSearch;
  long lVar11;
  ulong uVar12;
  XMLSize_t local_40;
  XMLUri *local_38;
  
  do {
    toSearch = uriStr;
    uriStr = toSearch + 1;
  } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)*toSearch] < '\0');
  lVar11 = 0;
  do {
    psVar1 = (short *)((long)toSearch + lVar11);
    lVar11 = lVar11 + 2;
  } while (*psVar1 != 0);
  uVar12 = lVar11 >> 1;
  do {
    if (uVar12 == 1) {
      return baseURI != (XMLUri *)0x0;
    }
    lVar11 = uVar12 - 2;
    uVar12 = uVar12 - 1;
  } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)toSearch[lVar11]] < '\0');
  local_40 = 0;
  local_38 = baseURI;
  iVar4 = XMLString::indexOf(toSearch,L':');
  iVar5 = XMLString::indexOf(toSearch,L'/');
  iVar6 = XMLString::indexOf(toSearch,L'?');
  iVar7 = XMLString::indexOf(toSearch,L'#');
  if (iVar4 < 1) {
    if (iVar4 == 0) {
      return false;
    }
  }
  else if (((iVar4 <= iVar5 || iVar5 == -1) && (iVar4 <= iVar6 || iVar6 == -1)) &&
          (iVar4 <= iVar7 || iVar7 == -1)) {
    bVar2 = processScheme(toSearch,&local_40);
    if (!bVar2) {
      return false;
    }
    uVar8 = local_40 + 1;
    if (uVar8 == uVar12) {
      return false;
    }
    bVar2 = true;
    if (toSearch[local_40 + 1] == L'#') {
      return false;
    }
    goto LAB_002554db;
  }
  bVar2 = false;
  if (local_38 == (XMLUri *)0x0 && iVar7 != 0) {
    return false;
  }
  uVar8 = 0;
LAB_002554db:
  if (((uVar8 + 1 < uVar12) &&
      (iVar4 = XMLString::compareNString(toSearch + uVar8,L"//",2), iVar4 == 0)) &&
     (uVar9 = uVar8 + 2, uVar8 = uVar9, uVar10 = uVar9, uVar9 < uVar12)) {
    do {
      if (((ulong)(ushort)toSearch[uVar10] < 0x40) &&
         (uVar8 = uVar10, (0x8000800800000000U >> ((ulong)(ushort)toSearch[uVar10] & 0x3f) & 1) != 0
         )) break;
      uVar10 = uVar10 + 1;
      uVar8 = uVar12;
    } while (uVar10 < uVar12);
    if ((uVar9 <= uVar8 && uVar8 - uVar9 != 0) &&
       (bVar3 = processAuthority(toSearch + uVar9,uVar8 - uVar9), !bVar3)) {
      return false;
    }
  }
  if ((uVar8 < uVar12) &&
     (bVar2 = processPath(toSearch + uVar8,uVar12 - uVar8,bVar2,bAllowSpaces), !bVar2)) {
    return false;
  }
  return true;
}

Assistant:

bool XMLUri::isValidURI(const XMLUri* const baseURI
                       , const XMLCh* const uriStr
                       , bool bAllowSpaces/*=false*/)
{
    // get a trimmed version of uriStr
    // uriStr will NO LONGER be used in this function.
    const XMLCh* trimmedUriSpec = uriStr;

    while (XMLChar1_0::isWhitespace(*trimmedUriSpec))
        trimmedUriSpec++;

    XMLSize_t trimmedUriSpecLen = XMLString::stringLen(trimmedUriSpec);

    while (trimmedUriSpecLen) {
        if (XMLChar1_0::isWhitespace(trimmedUriSpec[trimmedUriSpecLen-1]))
            trimmedUriSpecLen--;
        else
            break;
    }

    if (trimmedUriSpecLen == 0)
    {
        if (!baseURI)
            return false;
        else
            return true;
    }

    XMLSize_t index = 0;
    bool foundScheme = false;

    // Check for scheme, which must be before `/', '?' or '#'.
    int colonIdx = XMLString::indexOf(trimmedUriSpec, chColon);
    int slashIdx = XMLString::indexOf(trimmedUriSpec, chForwardSlash);
    int queryIdx = XMLString::indexOf(trimmedUriSpec, chQuestion);
    int fragmentIdx = XMLString::indexOf(trimmedUriSpec, chPound);

    if ((colonIdx <= 0) ||
        (colonIdx > slashIdx && slashIdx != -1) ||
        (colonIdx > queryIdx && queryIdx != -1) ||
        (colonIdx > fragmentIdx && fragmentIdx != -1))
    {
        // A standalone base is a valid URI according to spec
        if (colonIdx == 0 || (!baseURI && fragmentIdx != 0))
            return false;
    }
    else
    {
        if (!processScheme(trimmedUriSpec, index))
            return false;
        foundScheme = true;
        ++index;
    }

    // It's an error if we stop here
    if (index == trimmedUriSpecLen || (foundScheme && (trimmedUriSpec[index] == chPound)))
        return false;

	// two slashes means generic URI syntax, so we get the authority
    const XMLCh* authUriSpec = trimmedUriSpec +  index;
    if (((index+1) < trimmedUriSpecLen) &&
        XMLString::startsWith(authUriSpec, DOUBLE_SLASH))
    {
        index += 2;
        XMLSize_t startPos = index;

        // get authority - everything up to path, query or fragment
        XMLCh testChar;
        while (index < trimmedUriSpecLen)
        {
            testChar = trimmedUriSpec[index];
            if (testChar == chForwardSlash ||
                testChar == chQuestion     ||
                testChar == chPound         )
            {
                break;
            }

            index++;
        }

        // if we found authority, parse it out, otherwise we set the
        // host to empty string
        if (index > startPos)
        {
            if (!processAuthority(trimmedUriSpec + startPos, index - startPos))
                return false;
        }
    }

    // we need to check if index has exceed the lenght or not
    if (index < trimmedUriSpecLen)
    {
	    if (!processPath(trimmedUriSpec + index, trimmedUriSpecLen - index, foundScheme, bAllowSpaces))
            return false;
    }

    return true;
}